

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByLowercaseName(Descriptor *this,string_view lowercase_name)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *result;
  Descriptor *this_local;
  string_view lowercase_name_local;
  
  pFVar2 = file(this);
  lowercase_name_local._M_str =
       (char *)FileDescriptorTables::FindFieldByLowercaseName(pFVar2->tables_,this,lowercase_name);
  if (((FieldDescriptor *)lowercase_name_local._M_str == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)lowercase_name_local._M_str), bVar1))
  {
    lowercase_name_local._M_str = (char *)0x0;
  }
  return (FieldDescriptor *)lowercase_name_local._M_str;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByLowercaseName(
    absl::string_view lowercase_name) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, lowercase_name);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}